

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

void llvm::APInt::tcShiftLeft(WordType *Dst,uint Words,uint Count)

{
  sbyte sVar1;
  ulong uVar2;
  WordType *pWVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  if (Count == 0) {
    return;
  }
  uVar4 = Count >> 6;
  uVar7 = Words;
  if (uVar4 < Words) {
    uVar7 = uVar4;
  }
  if ((Count & 0x3f) == 0) {
    memmove(Dst + uVar7,Dst,(ulong)((Words - uVar7) * 8));
  }
  else if (uVar4 < Words) {
    uVar4 = Words - 1;
    sVar1 = (sbyte)(Count & 0x3f);
    uVar5 = Dst[uVar4 - uVar7] << sVar1;
    uVar2 = (ulong)uVar4;
    Dst[uVar2] = uVar5;
    if (uVar7 < uVar4) {
      uVar6 = (Words - 2) - uVar7;
      pWVar3 = Dst + (Words - 2);
      do {
        Dst[uVar2] = Dst[uVar6] >> (0x40U - sVar1 & 0x3f) | uVar5;
        uVar5 = Dst[uVar6] << sVar1;
        uVar4 = uVar4 - 1;
        uVar2 = (ulong)uVar4;
        *pWVar3 = uVar5;
        uVar6 = uVar6 - 1;
        pWVar3 = pWVar3 + -1;
      } while (uVar7 < uVar4);
    }
  }
  memset(Dst,0,(ulong)(uVar7 << 3));
  return;
}

Assistant:

void APInt::tcShiftLeft(WordType *Dst, unsigned Words, unsigned Count) {
  // Don't bother performing a no-op shift.
  if (!Count)
    return;

  // WordShift is the inter-part shift; BitShift is the intra-part shift.
  unsigned WordShift = std::min(Count / APINT_BITS_PER_WORD, Words);
  unsigned BitShift = Count % APINT_BITS_PER_WORD;

  // Fastpath for moving by whole words.
  if (BitShift == 0) {
    std::memmove(Dst + WordShift, Dst, (Words - WordShift) * APINT_WORD_SIZE);
  } else {
    while (Words-- > WordShift) {
      Dst[Words] = Dst[Words - WordShift] << BitShift;
      if (Words > WordShift)
        Dst[Words] |=
          Dst[Words - WordShift - 1] >> (APINT_BITS_PER_WORD - BitShift);
    }
  }

  // Fill in the remainder with 0s.
  std::memset(Dst, 0, WordShift * APINT_WORD_SIZE);
}